

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

bool QtPrivate::isBuiltinType(QByteArray *type)

{
  bool bVar1;
  int iVar2;
  storage_type *in_RDX;
  long in_FS_OFFSET;
  QByteArrayView typeName;
  QMetaType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  typeName.m_data = in_RDX;
  typeName.m_size = (qsizetype)(type->d).ptr;
  local_20 = QMetaType::fromName((QMetaType *)(type->d).size,typeName);
  iVar2 = QMetaType::registerHelper(&local_20);
  if ((iVar2 == 0) && ((type->d).size != 0)) {
    local_20.d_ptr = (QMetaTypeInterface *)0x458ccc;
    bVar1 = ::operator!=(type,(char **)&local_20);
    if (bVar1) {
      bVar1 = false;
      goto LAB_002667e0;
    }
  }
  bVar1 = iVar2 < 0x10000;
LAB_002667e0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

Q_CORE_EXPORT bool isBuiltinType(const QByteArray &type)
{
    int id = QMetaType::fromName(type).id();
    if (!id && !type.isEmpty() && type != "void")
        return false;
    return (id < QMetaType::User);
}